

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet(cmGlobalGenerator *this)

{
  cmInstallRuntimeDependencySet *this_00;
  _Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false> local_40;
  string local_38;
  
  this_00 = (cmInstallRuntimeDependencySet *)operator_new(0xa0);
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  cmInstallRuntimeDependencySet::cmInstallRuntimeDependencySet(this_00,&local_38);
  local_40._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
  ::
  emplace_back<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>
            ((vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
              *)&this->RuntimeDependencySets,
             (unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
              *)&local_40);
  if (local_40._M_head_impl != (cmInstallRuntimeDependencySet *)0x0) {
    std::default_delete<cmInstallRuntimeDependencySet>::operator()
              ((default_delete<cmInstallRuntimeDependencySet> *)&local_40,local_40._M_head_impl);
  }
  return this_00;
}

Assistant:

cmInstallRuntimeDependencySet*
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet()
{
  auto set = cm::make_unique<cmInstallRuntimeDependencySet>();
  auto* retval = set.get();
  this->RuntimeDependencySets.push_back(std::move(set));
  return retval;
}